

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

void __thiscall ON_OutlineAccumulator::Clear(ON_OutlineAccumulator *this)

{
  void *pvVar1;
  
  pvVar1 = *(void **)(this + 0x58);
  if (pvVar1 != (void *)0x0) {
    if (*(void **)(this + 0x50) == pvVar1) {
      *(undefined8 *)(this + 0x50) = 0;
    }
    ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray
              ((ON_ClassArray<ON_OutlineFigure> *)((long)pvVar1 + 0x60));
    operator_delete(pvVar1,0x78);
    *(undefined8 *)(this + 0x58) = 0;
  }
  if (*(ON_Outline **)(this + 0x50) != (ON_Outline *)0x0) {
    ON_Outline::operator=(*(ON_Outline **)(this + 0x50),&ON_Outline::Unset);
  }
  *(undefined4 *)this = 0;
  *(undefined2 *)(this + 4) = 0;
  *(undefined8 *)(this + 8) = 0;
  AbandonCurrentFigure(this);
  return;
}

Assistant:

void ON_OutlineAccumulator::Clear()
{
  if (m_managed_outline)
  {
    if (m_outline == m_managed_outline)
      m_outline = nullptr;
    delete m_managed_outline;
    m_managed_outline = nullptr;
  }

  if ( nullptr != m_outline)
    *m_outline = ON_Outline::Unset;

  m_units_per_em = 0;
  m_status = 0;
  m_figure_type = ON_OutlineFigure::Type::Unset;
  m_figure_depth = 0;
  m_error_count = 0;

  AbandonCurrentFigure();
}